

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O1

void brotli::HistogramRemap<brotli::Histogram<256>>
               (Histogram<256> *in,size_t in_size,Histogram<256> *out,uint32_t *symbols)

{
  uint uVar1;
  pointer puVar2;
  uint *puVar3;
  ulong uVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var5
  ;
  uint *puVar6;
  Histogram<256> *pHVar7;
  size_t sVar8;
  long lVar9;
  pointer puVar10;
  double dVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> all_symbols;
  allocator_type local_61;
  uint *local_60;
  Histogram<256> *local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  size_t local_38;
  
  local_58 = in;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_50,symbols,
             symbols + in_size,&local_61);
  puVar2 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar10 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar4 = (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar9 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar10,puVar2);
  }
  _Var5 = std::
          __unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_50,
             (long)_Var5._M_current -
             (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  puVar3 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = in_size;
  if (in_size != 0) {
    sVar8 = 0;
    do {
      puVar6 = symbols + (sVar8 - 1);
      if (sVar8 == 0) {
        puVar6 = symbols;
      }
      uVar4 = (ulong)*puVar6;
      pHVar7 = local_58 + sVar8;
      local_60 = (uint *)HistogramBitCostDistance<brotli::Histogram<256>>(pHVar7,out + uVar4);
      for (puVar10 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          puVar10 !=
          local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish; puVar10 = puVar10 + 1) {
        dVar11 = HistogramBitCostDistance<brotli::Histogram<256>>(pHVar7,out + *puVar10);
        if (dVar11 < (double)local_60) {
          uVar4 = (ulong)*puVar10;
          local_60 = (uint *)dVar11;
        }
      }
      symbols[sVar8] = (uint32_t)uVar4;
      sVar8 = sVar8 + 1;
      puVar3 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (sVar8 != local_38);
  }
  for (; local_60 = puVar3,
      puVar6 != local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
    uVar1 = *puVar6;
    memset(out + uVar1,0,0x408);
    out[uVar1].bit_cost_ = INFINITY;
    puVar3 = local_60;
  }
  if (local_38 != 0) {
    sVar8 = 0;
    pHVar7 = local_58;
    do {
      uVar1 = symbols[sVar8];
      out[uVar1].total_count_ = out[uVar1].total_count_ + local_58[sVar8].total_count_;
      lVar9 = 0;
      do {
        out[uVar1].data_[lVar9] = out[uVar1].data_[lVar9] + pHVar7->data_[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x100);
      sVar8 = sVar8 + 1;
      pHVar7 = pHVar7 + 1;
    } while (sVar8 != local_38);
  }
  if (local_60 != (uint *)0x0) {
    operator_delete(local_60,(long)local_50.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)local_60);
  }
  return;
}

Assistant:

void HistogramRemap(const HistogramType* in, size_t in_size,
                    HistogramType* out, uint32_t* symbols) {
  // Uniquify the list of symbols.
  std::vector<uint32_t> all_symbols(symbols, symbols + in_size);
  std::sort(all_symbols.begin(), all_symbols.end());
  std::vector<uint32_t>::iterator last =
      std::unique(all_symbols.begin(), all_symbols.end());
  all_symbols.resize(static_cast<size_t>(last - all_symbols.begin()));

  for (size_t i = 0; i < in_size; ++i) {
    uint32_t best_out = i == 0 ? symbols[0] : symbols[i - 1];
    double best_bits = HistogramBitCostDistance(in[i], out[best_out]);
    for (std::vector<uint32_t>::const_iterator k = all_symbols.begin();
         k != all_symbols.end(); ++k) {
      const double cur_bits = HistogramBitCostDistance(in[i], out[*k]);
      if (cur_bits < best_bits) {
        best_bits = cur_bits;
        best_out = *k;
      }
    }
    symbols[i] = best_out;
  }


  // Recompute each out based on raw and symbols.
  for (std::vector<uint32_t>::const_iterator k = all_symbols.begin();
       k != all_symbols.end(); ++k) {
    out[*k].Clear();
  }
  for (size_t i = 0; i < in_size; ++i) {
    out[symbols[i]].AddHistogram(in[i]);
  }
}